

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanLiteralContent(QXmlStreamReaderPrivate *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar5;
  long lVar6;
  ulong uVar4;
  
  lVar6 = 0;
  do {
    uVar1 = getChar(this);
    if (uVar1 == 0xffffffff) {
      return lVar6;
    }
    uVar2 = uVar1 & 0xffff;
    uVar4 = (ulong)uVar2;
    uVar3 = uVar1;
    if ((ushort)uVar1 < 0x3d) {
      if ((0x100000c400000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0xd) {
          uVar3 = filterCarriageReturn(this);
          if (uVar3 == 0) {
            return lVar6;
          }
          goto LAB_00359bdd;
        }
        if (uVar4 != 0x20) goto LAB_00359bb1;
        goto LAB_00359bf9;
      }
      if ((uVar1 & 0xff0000) == 0) goto LAB_00359c1b;
    }
    else {
LAB_00359bb1:
      if (uVar2 != 9) {
        if (uVar2 != 10) {
          if (((uVar2 - 0xfffe < 2) || (uVar2 == 0)) || (uVar1 < 0x20)) {
LAB_00359c1b:
            puVar5 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
            *puVar5 = uVar1;
            return lVar6;
          }
          goto LAB_00359c09;
        }
LAB_00359bdd:
        this->lineNumber = this->lineNumber + 1;
        this->lastLineStart = this->readBufferPos + this->characterOffset;
      }
LAB_00359bf9:
      uVar3 = 0x20;
      if ((this->field_0x3a8 & 0x20) == 0) {
        uVar3 = uVar1;
      }
    }
LAB_00359c09:
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar3);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanLiteralContent()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            /* The putChar() call is necessary so the parser re-gets
             * the character from the input source, when raising an error. */
            putChar(c);
            return n;
        case '\r':
            if (filterCarriageReturn() == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            if (normalizeLiterals)
                textBuffer += u' ';
            else
                textBuffer += QChar(c);
            ++n;
            break;
        case '&':
        case '<':
        case '\"':
        case '\'':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}